

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void sorter_merge_sort(int64_t *dst,size_t size)

{
  int64_t *newdst;
  
  if (size < 2) {
    return;
  }
  if (size < 0x11) {
    sorter_binary_insertion_sort_start(dst,1,size);
    return;
  }
  newdst = (int64_t *)malloc(size * 8);
  sorter_merge_sort_recursive(newdst,dst,size);
  free(newdst);
  return;
}

Assistant:

void MERGE_SORT(SORT_TYPE *dst, const size_t size) {
  SORT_TYPE *newdst;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  if (size <= SMALL_SORT_BND) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  newdst = SORT_NEW_BUFFER(size);
  MERGE_SORT_RECURSIVE(newdst, dst, size);
  SORT_DELETE_BUFFER(newdst);
}